

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExprLexer.cxx
# Opt level: O0

int yy_get_next_buffer(yyscan_t yyscanner)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  size_t sVar7;
  yy_size_t size;
  void *pvVar8;
  bool bVar9;
  yy_size_t new_size_1;
  yy_size_t n;
  int c;
  yy_size_t new_size;
  int yy_c_buf_p_offset;
  YY_BUFFER_STATE_conflict b;
  yy_size_t num_to_read;
  int local_38;
  int ret_val;
  int i;
  int number_to_move;
  char *source;
  char *dest;
  yyguts_t_conflict1 *yyg;
  yyscan_t yyscanner_local;
  
  if ((ulong)(*(long *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                                 *(long *)((long)yyscanner + 0x18) * 8) + 8) +
             *(long *)((long)yyscanner + 0x38) + 1) < *(ulong *)((long)yyscanner + 0x48)) {
    yy_fatal_error("fatal flex scanner internal error--end of buffer missed",yyscanner);
  }
  if (*(int *)(*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8)
              + 0x3c) == 0) {
    if (*(long *)((long)yyscanner + 0x48) - *(long *)((long)yyscanner + 0x88) == 1) {
      yyscanner_local._4_4_ = 1;
    }
    else {
      yyscanner_local._4_4_ = 2;
    }
  }
  else {
    iVar4 = ((int)*(undefined8 *)((long)yyscanner + 0x48) -
            (int)*(undefined8 *)((long)yyscanner + 0x88)) + -1;
    _i = *(char **)((long)yyscanner + 0x88);
    source = *(char **)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                                 *(long *)((long)yyscanner + 0x18) * 8) + 8);
    for (local_38 = 0; local_38 < iVar4; local_38 = local_38 + 1) {
      *source = *_i;
      _i = _i + 1;
      source = source + 1;
    }
    if (*(int *)(*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8
                          ) + 0x40) == 2) {
      *(undefined8 *)((long)yyscanner + 0x38) = 0;
      *(undefined8 *)
       (*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8) + 0x20)
           = 0;
    }
    else {
      iVar5 = *(int *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                                *(long *)((long)yyscanner + 0x18) * 8) + 0x18) - iVar4;
      while (b = (YY_BUFFER_STATE_conflict)(long)(iVar5 + -1), b == (YY_BUFFER_STATE_conflict)0x0) {
        lVar1 = *(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8)
        ;
        uVar2 = *(undefined8 *)((long)yyscanner + 0x48);
        uVar3 = *(undefined8 *)(lVar1 + 8);
        if (*(int *)(lVar1 + 0x28) == 0) {
          *(undefined8 *)(lVar1 + 8) = 0;
        }
        else {
          if ((*(uint *)(lVar1 + 0x18) & 0x7fffffff) == 0) {
            *(int *)(lVar1 + 0x18) = *(int *)(lVar1 + 0x18) / 8 + *(int *)(lVar1 + 0x18);
          }
          else {
            *(int *)(lVar1 + 0x18) = *(int *)(lVar1 + 0x18) << 1;
          }
          pvVar8 = cmGccDepfile_yyrealloc
                             (*(void **)(lVar1 + 8),(long)(*(int *)(lVar1 + 0x18) + 2),yyscanner);
          *(void **)(lVar1 + 8) = pvVar8;
        }
        if (*(long *)(lVar1 + 8) == 0) {
          yy_fatal_error("fatal error - scanner input buffer overflow",yyscanner);
        }
        *(long *)((long)yyscanner + 0x48) = *(long *)(lVar1 + 8) + (long)((int)uVar2 - (int)uVar3);
        iVar5 = *(int *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                                  *(long *)((long)yyscanner + 0x18) * 8) + 0x18) - iVar4;
      }
      if ((YY_BUFFER_STATE_conflict)0x2000 < b) {
        b = (YY_BUFFER_STATE_conflict)0x2000;
      }
      if (*(int *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                            *(long *)((long)yyscanner + 0x18) * 8) + 0x2c) == 0) {
        piVar6 = __errno_location();
        *piVar6 = 0;
        while( true ) {
          sVar7 = fread((void *)(*(long *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                                                    *(long *)((long)yyscanner + 0x18) * 8) + 8) +
                                (long)iVar4),1,(size_t)b,*(FILE **)((long)yyscanner + 8));
          *(long *)((long)yyscanner + 0x38) = (long)(int)sVar7;
          bVar9 = false;
          if ((long)(int)sVar7 == 0) {
            iVar5 = ferror(*(FILE **)((long)yyscanner + 8));
            bVar9 = iVar5 != 0;
          }
          if (!bVar9) break;
          piVar6 = __errno_location();
          if (*piVar6 != 4) {
            yy_fatal_error("input in flex scanner failed",yyscanner);
          }
          piVar6 = __errno_location();
          *piVar6 = 0;
          clearerr(*(FILE **)((long)yyscanner + 8));
        }
      }
      else {
        n._4_4_ = 0x2a;
        new_size_1 = 0;
        while( true ) {
          bVar9 = false;
          if (new_size_1 < b) {
            n._4_4_ = getc(*(FILE **)((long)yyscanner + 8));
            bVar9 = false;
            if (n._4_4_ != -1) {
              bVar9 = n._4_4_ != 10;
            }
          }
          if (!bVar9) break;
          *(char *)(*(long *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                                       *(long *)((long)yyscanner + 0x18) * 8) + 8) + (long)iVar4 +
                   new_size_1) = (char)n._4_4_;
          new_size_1 = new_size_1 + 1;
        }
        if (n._4_4_ == 10) {
          *(char *)(*(long *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                                       *(long *)((long)yyscanner + 0x18) * 8) + 8) + (long)iVar4 +
                   new_size_1) = (char)n._4_4_;
          new_size_1 = new_size_1 + 1;
        }
        if ((n._4_4_ == -1) && (iVar5 = ferror(*(FILE **)((long)yyscanner + 8)), iVar5 != 0)) {
          yy_fatal_error("input in flex scanner failed",yyscanner);
        }
        *(yy_size_t *)((long)yyscanner + 0x38) = new_size_1;
      }
      *(undefined8 *)
       (*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8) + 0x20)
           = *(undefined8 *)((long)yyscanner + 0x38);
    }
    if (*(long *)((long)yyscanner + 0x38) == 0) {
      if (iVar4 == 0) {
        num_to_read._4_4_ = 1;
        cmGccDepfile_yyrestart(*(FILE **)((long)yyscanner + 8),yyscanner);
      }
      else {
        num_to_read._4_4_ = 2;
        *(undefined4 *)
         (*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8) +
         0x40) = 2;
      }
    }
    else {
      num_to_read._4_4_ = 0;
    }
    if ((ulong)(long)*(int *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                                       *(long *)((long)yyscanner + 0x18) * 8) + 0x18) <
        (ulong)(*(long *)((long)yyscanner + 0x38) + (long)iVar4)) {
      size = *(long *)((long)yyscanner + 0x38) + (long)iVar4 +
             (*(ulong *)((long)yyscanner + 0x38) >> 1);
      pvVar8 = cmGccDepfile_yyrealloc
                         (*(void **)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                                              *(long *)((long)yyscanner + 0x18) * 8) + 8),size,
                          yyscanner);
      *(void **)(*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8
                          ) + 8) = pvVar8;
      if (*(long *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                             *(long *)((long)yyscanner + 0x18) * 8) + 8) == 0) {
        yy_fatal_error("out of dynamic memory in yy_get_next_buffer()",yyscanner);
      }
      *(int *)(*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8)
              + 0x18) = (int)size + -2;
    }
    *(long *)((long)yyscanner + 0x38) = (long)iVar4 + *(long *)((long)yyscanner + 0x38);
    *(undefined1 *)
     (*(long *)(*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8)
               + 8) + *(long *)((long)yyscanner + 0x38)) = 0;
    *(undefined1 *)
     (*(long *)(*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8)
               + 8) + 1 + *(long *)((long)yyscanner + 0x38)) = 0;
    *(undefined8 *)((long)yyscanner + 0x88) =
         *(undefined8 *)
          (*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8) + 8)
    ;
    yyscanner_local._4_4_ = num_to_read._4_4_;
  }
  return yyscanner_local._4_4_;
}

Assistant:

static int yy_get_next_buffer (yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;
	char *dest = YY_CURRENT_BUFFER_LVALUE->yy_ch_buf;
	char *source = yyg->yytext_ptr;
	int number_to_move, i;
	int ret_val;

	if ( yyg->yy_c_buf_p > &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[yyg->yy_n_chars + 1] )
		YY_FATAL_ERROR(
		"fatal flex scanner internal error--end of buffer missed" );

	if ( YY_CURRENT_BUFFER_LVALUE->yy_fill_buffer == 0 )
		{ /* Don't try to fill the buffer, so this is an EOF. */
		if ( yyg->yy_c_buf_p - yyg->yytext_ptr - YY_MORE_ADJ == 1 )
			{
			/* We matched a single character, the EOB, so
			 * treat this as a final EOF.
			 */
			return EOB_ACT_END_OF_FILE;
			}

		else
			{
			/* We matched some text prior to the EOB, first
			 * process it.
			 */
			return EOB_ACT_LAST_MATCH;
			}
		}

	/* Try to read more data. */

	/* First move last chars to start of buffer. */
	number_to_move = (int) (yyg->yy_c_buf_p - yyg->yytext_ptr - 1);

	for ( i = 0; i < number_to_move; ++i )
		*(dest++) = *(source++);

	if ( YY_CURRENT_BUFFER_LVALUE->yy_buffer_status == YY_BUFFER_EOF_PENDING )
		/* don't do the read, it's not guaranteed to return an EOF,
		 * just force an EOF
		 */
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = yyg->yy_n_chars = 0;

	else
		{
			int num_to_read =
			YY_CURRENT_BUFFER_LVALUE->yy_buf_size - number_to_move - 1;

		while ( num_to_read <= 0 )
			{ /* Not enough room in the buffer - grow it. */

			/* just a shorter name for the current buffer */
			YY_BUFFER_STATE b = YY_CURRENT_BUFFER_LVALUE;

			int yy_c_buf_p_offset =
				(int) (yyg->yy_c_buf_p - b->yy_ch_buf);

			if ( b->yy_is_our_buffer )
				{
				int new_size = b->yy_buf_size * 2;

				if ( new_size <= 0 )
					b->yy_buf_size += b->yy_buf_size / 8;
				else
					b->yy_buf_size *= 2;

				b->yy_ch_buf = (char *)
					/* Include room in for 2 EOB chars. */
					yyrealloc( (void *) b->yy_ch_buf,
							 (yy_size_t) (b->yy_buf_size + 2) , yyscanner );
				}
			else
				/* Can't grow it, we don't own it. */
				b->yy_ch_buf = NULL;

			if ( ! b->yy_ch_buf )
				YY_FATAL_ERROR(
				"fatal error - scanner input buffer overflow" );

			yyg->yy_c_buf_p = &b->yy_ch_buf[yy_c_buf_p_offset];

			num_to_read = YY_CURRENT_BUFFER_LVALUE->yy_buf_size -
						number_to_move - 1;

			}

		if ( num_to_read > YY_READ_BUF_SIZE )
			num_to_read = YY_READ_BUF_SIZE;

		/* Read in more data. */
		YY_INPUT( (&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move]),
			yyg->yy_n_chars, num_to_read );

		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = yyg->yy_n_chars;
		}

	if ( yyg->yy_n_chars == 0 )
		{
		if ( number_to_move == YY_MORE_ADJ )
			{
			ret_val = EOB_ACT_END_OF_FILE;
			yyrestart( yyin  , yyscanner);
			}

		else
			{
			ret_val = EOB_ACT_LAST_MATCH;
			YY_CURRENT_BUFFER_LVALUE->yy_buffer_status =
				YY_BUFFER_EOF_PENDING;
			}
		}

	else
		ret_val = EOB_ACT_CONTINUE_SCAN;

	if ((yyg->yy_n_chars + number_to_move) > YY_CURRENT_BUFFER_LVALUE->yy_buf_size) {
		/* Extend the array by 50%, plus the number we really need. */
		int new_size = yyg->yy_n_chars + number_to_move + (yyg->yy_n_chars >> 1);
		YY_CURRENT_BUFFER_LVALUE->yy_ch_buf = (char *) yyrealloc(
			(void *) YY_CURRENT_BUFFER_LVALUE->yy_ch_buf, (yy_size_t) new_size , yyscanner );
		if ( ! YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			YY_FATAL_ERROR( "out of dynamic memory in yy_get_next_buffer()" );
		/* "- 2" to take care of EOB's */
		YY_CURRENT_BUFFER_LVALUE->yy_buf_size = (int) (new_size - 2);
	}

	yyg->yy_n_chars += number_to_move;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[yyg->yy_n_chars] = YY_END_OF_BUFFER_CHAR;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[yyg->yy_n_chars + 1] = YY_END_OF_BUFFER_CHAR;

	yyg->yytext_ptr = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[0];

	return ret_val;
}